

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

kwsysProcessTime kwsysProcessTimeSubtract(kwsysProcessTime in1,kwsysProcessTime in2)

{
  kwsysProcessTime kVar1;
  kwsysProcessTime in2_local;
  kwsysProcessTime in1_local;
  kwsysProcessTime out;
  
  in1_local.tv_usec = in1.tv_sec - in2.tv_sec;
  out.tv_sec = in1.tv_usec - in2.tv_usec;
  if (out.tv_sec < 0) {
    out.tv_sec = out.tv_sec + 1000000;
    in1_local.tv_usec = in1_local.tv_usec + -1;
  }
  kVar1.tv_usec = out.tv_sec;
  kVar1.tv_sec = in1_local.tv_usec;
  return kVar1;
}

Assistant:

static kwsysProcessTime kwsysProcessTimeSubtract(kwsysProcessTime in1, kwsysProcessTime in2)
{
  kwsysProcessTime out;
  out.tv_sec = in1.tv_sec - in2.tv_sec;
  out.tv_usec = in1.tv_usec - in2.tv_usec;
  if(out.tv_usec < 0)
    {
    out.tv_usec += 1000000;
    out.tv_sec -= 1;
    }
  return out;
}